

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_fetch_block_scalar(yaml_parser_t *parser,int literal)

{
  size_t *psVar1;
  yaml_char_t **ppyVar2;
  yaml_token_t **tail;
  byte bVar3;
  yaml_char_t yVar4;
  yaml_simple_key_t *pyVar5;
  size_t sVar6;
  size_t sVar7;
  yaml_mark_t start_mark_00;
  yaml_mark_t start_mark_01;
  int iVar8;
  int iVar9;
  undefined1 (*pauVar10) [16];
  byte *pbVar11;
  char *pcVar12;
  byte bVar13;
  uint uVar14;
  size_t sVar15;
  long lVar16;
  undefined8 *puVar17;
  yaml_token_t *pyVar18;
  bool bVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  yaml_mark_t start_mark;
  yaml_mark_t end_mark;
  yaml_token_t token;
  undefined1 local_128 [8];
  undefined1 (*pauStack_120) [16];
  undefined1 (*local_118 [2]) [16];
  undefined1 (*local_108) [16];
  undefined1 (*pauStack_100) [16];
  undefined1 (*pauStack_f8) [16];
  int local_f0;
  int local_ec;
  yaml_string_t local_e8;
  size_t local_c8;
  size_t sStack_c0;
  size_t local_b8;
  yaml_mark_t local_a8;
  undefined1 local_88 [8];
  undefined1 (*pauStack_80) [16];
  long local_78;
  int iStack_70;
  undefined4 uStack_6c;
  size_t local_68;
  size_t sStack_60;
  size_t local_58;
  size_t local_50;
  size_t sStack_48;
  size_t local_40;
  
  bVar20 = 0;
  pyVar5 = (parser->simple_keys).top;
  if ((pyVar5[-1].possible != 0) && (pyVar5[-1].required != 0)) {
    sVar15 = pyVar5[-1].mark.column;
    sVar6 = pyVar5[-1].mark.index;
    sVar7 = pyVar5[-1].mark.line;
    parser->error = YAML_SCANNER_ERROR;
    parser->context = "while scanning a simple key";
    (parser->context_mark).index = sVar6;
    (parser->context_mark).line = sVar7;
    (parser->context_mark).column = sVar15;
    parser->problem = "could not find expected \':\'";
    sVar15 = (parser->mark).line;
    (parser->problem_mark).index = (parser->mark).index;
    (parser->problem_mark).line = sVar15;
    (parser->problem_mark).column = (parser->mark).column;
    return 0;
  }
  pyVar5[-1].possible = 0;
  parser->simple_key_allowed = 1;
  pauStack_100 = (undefined1 (*) [16])0x0;
  pauStack_f8 = (undefined1 (*) [16])0x0;
  local_118[0] = (undefined1 (*) [16])0x0;
  _local_128 = (undefined1  [16])0x0;
  local_e8.pointer = (yaml_char_t *)0x0;
  local_e8.start = (yaml_char_t *)0x0;
  local_e8.end = (yaml_char_t *)0x0;
  local_f0 = 0;
  local_108 = (undefined1 (*) [16])yaml_malloc(0x10);
  if (local_108 != (undefined1 (*) [16])0x0) {
    pauStack_100 = local_108 + 1;
    *local_108 = (undefined1  [16])0x0;
    pauStack_f8 = local_108;
    pauVar10 = (undefined1 (*) [16])yaml_malloc(0x10);
    local_128 = (undefined1  [8])pauVar10;
    if (pauVar10 != (undefined1 (*) [16])0x0) {
      pauStack_120 = pauVar10 + 1;
      *pauVar10 = (undefined1  [16])0x0;
      local_118[0] = pauVar10;
      pauVar10 = (undefined1 (*) [16])yaml_malloc(0x10);
      local_e8.start = (yaml_char_t *)pauVar10;
      if (pauVar10 != (undefined1 (*) [16])0x0) {
        local_e8.end = (yaml_char_t *)(pauVar10 + 1);
        *pauVar10 = (undefined1  [16])0x0;
        local_b8 = (parser->mark).column;
        local_c8 = (parser->mark).index;
        sStack_c0 = (parser->mark).line;
        (parser->mark).index = (parser->mark).index + 1;
        psVar1 = &(parser->mark).column;
        *psVar1 = *psVar1 + 1;
        pbVar11 = (parser->buffer).pointer;
        sVar15 = parser->unread - 1;
        parser->unread = sVar15;
        bVar13 = *pbVar11;
        lVar16 = 1;
        if ((((char)bVar13 < '\0') && (lVar16 = 2, (bVar13 & 0xe0) != 0xc0)) &&
           (lVar16 = 3, (bVar13 & 0xf0) != 0xe0)) {
          lVar16 = (ulong)((bVar13 & 0xf8) == 0xf0) << 2;
        }
        pbVar11 = pbVar11 + lVar16;
        (parser->buffer).pointer = pbVar11;
        local_e8.pointer = (yaml_char_t *)pauVar10;
        if (sVar15 == 0) {
          iVar8 = yaml_parser_update_buffer(parser,1);
          if (iVar8 == 0) goto LAB_00112648;
          pbVar11 = (parser->buffer).pointer;
        }
        bVar13 = *pbVar11;
        if ((bVar13 == 0x2d) || (bVar13 == 0x2b)) {
          (parser->mark).index = (parser->mark).index + 1;
          psVar1 = &(parser->mark).column;
          *psVar1 = *psVar1 + 1;
          sVar15 = parser->unread - 1;
          parser->unread = sVar15;
          bVar3 = *pbVar11;
          lVar16 = 1;
          if ((((char)bVar3 < '\0') && (lVar16 = 2, (bVar3 & 0xe0) != 0xc0)) &&
             (lVar16 = 3, (bVar3 & 0xf0) != 0xe0)) {
            lVar16 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
          }
          pbVar11 = pbVar11 + lVar16;
          (parser->buffer).pointer = pbVar11;
          if (sVar15 == 0) {
            iVar8 = yaml_parser_update_buffer(parser,1);
            if (iVar8 == 0) goto LAB_00112648;
            pbVar11 = (parser->buffer).pointer;
          }
          local_ec = (uint)(bVar13 == 0x2b) * 2 + -1;
          bVar13 = *pbVar11;
          iVar8 = 0;
          if (9 < (byte)(bVar13 - 0x30)) goto LAB_00111c2c;
          if (bVar13 != 0x30) {
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            parser->unread = parser->unread - 1;
            bVar3 = *pbVar11;
            lVar16 = 1;
            if ((((char)bVar3 < '\0') && (lVar16 = 2, (bVar3 & 0xe0) != 0xc0)) &&
               (lVar16 = 3, (bVar3 & 0xf0) != 0xe0)) {
              lVar16 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
            }
            iVar8 = bVar13 - 0x30;
            pbVar11 = pbVar11 + lVar16;
LAB_00111c25:
            (parser->buffer).pointer = pbVar11;
            goto LAB_00111c2c;
          }
LAB_00111adc:
          parser->error = YAML_SCANNER_ERROR;
          parser->context = "while scanning a block scalar";
          (parser->context_mark).index = local_c8;
          (parser->context_mark).line = sStack_c0;
          (parser->context_mark).column = local_b8;
          pcVar12 = "found an indentation indicator equal to 0";
LAB_00111c38:
          parser->problem = pcVar12;
          sVar15 = (parser->mark).line;
          (parser->problem_mark).index = (parser->mark).index;
          (parser->problem_mark).line = sVar15;
          (parser->problem_mark).column = (parser->mark).column;
          goto LAB_00112648;
        }
        local_ec = 0;
        if ((byte)(bVar13 - 0x30) < 10) {
          if (bVar13 == 0x30) goto LAB_00111adc;
          (parser->mark).index = (parser->mark).index + 1;
          psVar1 = &(parser->mark).column;
          *psVar1 = *psVar1 + 1;
          sVar15 = parser->unread - 1;
          parser->unread = sVar15;
          bVar3 = *pbVar11;
          lVar16 = 1;
          if ((((char)bVar3 < '\0') && (lVar16 = 2, (bVar3 & 0xe0) != 0xc0)) &&
             (lVar16 = 3, (bVar3 & 0xf0) != 0xe0)) {
            lVar16 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
          }
          pbVar11 = pbVar11 + lVar16;
          (parser->buffer).pointer = pbVar11;
          if (sVar15 == 0) {
            iVar8 = yaml_parser_update_buffer(parser,1);
            if (iVar8 == 0) goto LAB_00112648;
            pbVar11 = (parser->buffer).pointer;
          }
          iVar8 = bVar13 - 0x30;
          bVar13 = *pbVar11;
          if ((bVar13 == 0x2d) || (bVar13 == 0x2b)) {
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            parser->unread = parser->unread - 1;
            bVar3 = *pbVar11;
            lVar16 = 1;
            if (((char)bVar3 < '\0') &&
               ((lVar16 = 2, (bVar3 & 0xe0) != 0xc0 && (lVar16 = 3, (bVar3 & 0xf0) != 0xe0)))) {
              lVar16 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
            }
            local_ec = (uint)(bVar13 == 0x2b) * 2 + -1;
            pbVar11 = pbVar11 + lVar16;
            goto LAB_00111c25;
          }
        }
        else {
          iVar8 = 0;
        }
LAB_00111c2c:
        sVar15 = parser->unread;
        while( true ) {
          if ((sVar15 == 0) && (iVar9 = yaml_parser_update_buffer(parser,1), iVar9 == 0))
          goto LAB_00112648;
          pbVar11 = (parser->buffer).pointer;
          bVar13 = *pbVar11;
          uVar14 = (uint)bVar13;
          if ((bVar13 != 9) && (bVar13 != 0x20)) break;
          (parser->mark).index = (parser->mark).index + 1;
          psVar1 = &(parser->mark).column;
          *psVar1 = *psVar1 + 1;
          sVar15 = parser->unread - 1;
          parser->unread = sVar15;
          bVar13 = *pbVar11;
          lVar16 = 1;
          if ((((char)bVar13 < '\0') && (lVar16 = 2, (bVar13 & 0xe0) != 0xc0)) &&
             (lVar16 = 3, (bVar13 & 0xf0) != 0xe0)) {
            lVar16 = (ulong)((bVar13 & 0xf8) == 0xf0) << 2;
          }
          (parser->buffer).pointer = pbVar11 + lVar16;
        }
        if (bVar13 == 0x23) {
          do {
            if ((char)uVar14 == -0x3e) {
              if (pbVar11[1] == 0x85) {
                bVar13 = 0xc2;
                goto LAB_00111e5d;
              }
            }
            else if (((uVar14 != 0xe2) && (uVar14 < 0xe)) && ((0x2401U >> (uVar14 & 0x1f) & 1) != 0)
                    ) break;
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            sVar15 = parser->unread - 1;
            parser->unread = sVar15;
            bVar13 = *pbVar11;
            lVar16 = 1;
            if ((((char)bVar13 < '\0') && (lVar16 = 2, (bVar13 & 0xe0) != 0xc0)) &&
               (lVar16 = 3, (bVar13 & 0xf0) != 0xe0)) {
              lVar16 = (ulong)((bVar13 & 0xf8) == 0xf0) << 2;
            }
            pbVar11 = pbVar11 + lVar16;
            (parser->buffer).pointer = pbVar11;
            if (sVar15 == 0) {
              iVar9 = yaml_parser_update_buffer(parser,1);
              if (iVar9 == 0) goto LAB_00112648;
              pbVar11 = (parser->buffer).pointer;
            }
            uVar14 = (uint)*pbVar11;
          } while( true );
        }
        bVar13 = (byte)uVar14;
        if (uVar14 < 0xd) {
          if (uVar14 != 0) {
            if (uVar14 != 10) goto LAB_00111e26;
            goto LAB_00111e5d;
          }
        }
        else {
          if ((uVar14 != 0xd) &&
             (((uVar14 == 0xe2 || (uVar14 != 0xc2)) || (bVar13 = 0xc2, pbVar11[1] != 0x85)))) {
LAB_00111e26:
            parser->error = YAML_SCANNER_ERROR;
            parser->context = "while scanning a block scalar";
            (parser->context_mark).index = local_c8;
            (parser->context_mark).line = sStack_c0;
            (parser->context_mark).column = local_b8;
            pcVar12 = "did not find expected comment or line break";
            goto LAB_00111c38;
          }
LAB_00111e5d:
          if (parser->unread < 2) {
            iVar9 = yaml_parser_update_buffer(parser,2);
            if (iVar9 == 0) goto LAB_00112648;
            pbVar11 = (parser->buffer).pointer;
            bVar13 = *pbVar11;
          }
          if (bVar13 < 0xc2) {
            if (bVar13 == 10) {
LAB_00111f0b:
              (parser->mark).column = 0;
              auVar21._8_4_ = 0xffffffff;
              auVar21._0_8_ = 0xffffffffffffffff;
              auVar21._12_4_ = 0xffffffff;
              (parser->mark).index = (parser->mark).index + 1;
              (parser->mark).line = (parser->mark).line - auVar21._8_8_;
              parser->unread = parser->unread - 1;
              bVar13 = *pbVar11;
              lVar16 = 1;
              if ((((char)bVar13 < '\0') && (lVar16 = 2, (bVar13 & 0xe0) != 0xc0)) &&
                 (lVar16 = 3, (bVar13 & 0xf0) != 0xe0)) {
                lVar16 = (ulong)((bVar13 & 0xf8) == 0xf0) << 2;
              }
            }
            else {
              if (bVar13 != 0xd) goto LAB_00111f80;
              if (pbVar11[1] != 10) goto LAB_00111f0b;
              (parser->mark).column = 0;
              (parser->mark).index = (parser->mark).index + 2;
              (parser->mark).line = (parser->mark).line + 1;
              parser->unread = parser->unread - 2;
              lVar16 = 2;
            }
            (parser->buffer).pointer = pbVar11 + lVar16;
          }
          else if ((bVar13 == 0xc2) && (pbVar11[1] == 0x85)) goto LAB_00111f0b;
        }
LAB_00111f80:
        local_a8.column = (parser->mark).column;
        local_a8.index = (parser->mark).index;
        local_a8.line = (parser->mark).line;
        if (iVar8 != 0) {
          local_f0 = 0;
          if (0 < parser->indent) {
            local_f0 = parser->indent;
          }
          local_f0 = local_f0 + iVar8;
        }
        start_mark_00.line = sStack_c0;
        start_mark_00.index = local_c8;
        start_mark_00.column = local_b8;
        iVar8 = yaml_parser_scan_block_scalar_breaks
                          (parser,&local_f0,&local_e8,start_mark_00,&local_a8);
        if ((iVar8 != 0) &&
           ((parser->unread != 0 || (iVar8 = yaml_parser_update_buffer(parser,1), iVar8 != 0)))) {
          bVar19 = false;
LAB_0011201f:
          iVar8 = local_ec;
          if (local_f0 == (int)(parser->mark).column) {
            yVar4 = *(parser->buffer).pointer;
            bVar13 = 1;
            if ((yVar4 != '\t') && (yVar4 != ' ')) {
              if (yVar4 == '\0') goto LAB_001124b8;
              bVar13 = 0;
            }
            if ((literal != 0) || ((bool)(bVar13 | bVar19) || *(undefined1 *)local_128 != '\n')) {
              iVar8 = yaml_string_join((yaml_char_t **)&local_108,(yaml_char_t **)&pauStack_f8,
                                       (yaml_char_t **)&pauStack_100,(yaml_char_t **)local_128,
                                       (yaml_char_t **)local_118,(yaml_char_t **)(local_128 + 8));
              if (iVar8 == 0) goto LAB_00112642;
LAB_00112092:
            }
            else if (*local_e8.start == '\0') {
              if (((undefined1 (*) [16])(*pauStack_f8 + 5) < pauStack_100) ||
                 (iVar8 = yaml_string_extend((yaml_char_t **)&local_108,(yaml_char_t **)&pauStack_f8
                                             ,(yaml_char_t **)&pauStack_100), iVar8 != 0)) {
                (*pauStack_f8)[0] = 0x20;
                pauStack_f8 = (undefined1 (*) [16])(*pauStack_f8 + 1);
                goto LAB_00112092;
              }
              goto LAB_00112642;
            }
            local_118[0] = (undefined1 (*) [16])local_128;
            memset((void *)local_128,0,(long)pauStack_120 - (long)local_128);
            iVar8 = yaml_string_join((yaml_char_t **)&local_108,(yaml_char_t **)&pauStack_f8,
                                     (yaml_char_t **)&pauStack_100,&local_e8.start,
                                     (yaml_char_t **)((long)&local_e8 + 0x10),
                                     (yaml_char_t **)((long)&local_e8 + 8));
            if (iVar8 != 0) {
              local_e8.pointer = local_e8.start;
              memset(local_e8.start,0,(long)local_e8.end - (long)local_e8.start);
              pbVar11 = (parser->buffer).pointer;
              bVar13 = *pbVar11;
              bVar19 = bVar13 == 9 || bVar13 == 0x20;
              do {
                if (bVar13 == 0xc2) {
                  if (pbVar11[1] == 0x85) goto LAB_00112274;
                }
                else if (((bVar13 != 0xe2) && (bVar13 < 0xe)) &&
                        ((0x2401U >> (bVar13 & 0x1f) & 1) != 0)) goto LAB_00112274;
                if (pauStack_100 <= (undefined1 (*) [16])(*pauStack_f8 + 5)) {
                  iVar8 = yaml_string_extend((yaml_char_t **)&local_108,(yaml_char_t **)&pauStack_f8
                                             ,(yaml_char_t **)&pauStack_100);
                  if (iVar8 == 0) break;
                  pbVar11 = (parser->buffer).pointer;
                  bVar13 = *pbVar11;
                }
                if ((char)bVar13 < '\0') {
                  if ((bVar13 & 0xe0) == 0xc0) {
LAB_001121f9:
                    (parser->buffer).pointer = pbVar11 + 1;
                    (*pauStack_f8)[0] = *pbVar11;
                    pbVar11 = (parser->buffer).pointer;
                    pauStack_f8 = (undefined1 (*) [16])(*pauStack_f8 + 1);
                    goto LAB_0011221d;
                  }
                  if ((bVar13 & 0xf0) == 0xe0) {
LAB_001121d5:
                    (parser->buffer).pointer = pbVar11 + 1;
                    (*pauStack_f8)[0] = *pbVar11;
                    pbVar11 = (parser->buffer).pointer;
                    pauStack_f8 = (undefined1 (*) [16])(*pauStack_f8 + 1);
                    goto LAB_001121f9;
                  }
                  if ((bVar13 & 0xf8) == 0xf0) {
                    (parser->buffer).pointer = pbVar11 + 1;
                    (*pauStack_f8)[0] = *pbVar11;
                    pbVar11 = (parser->buffer).pointer;
                    pauStack_f8 = (undefined1 (*) [16])(*pauStack_f8 + 1);
                    goto LAB_001121d5;
                  }
                }
                else {
LAB_0011221d:
                  (parser->buffer).pointer = pbVar11 + 1;
                  (*pauStack_f8)[0] = *pbVar11;
                  pauStack_f8 = (undefined1 (*) [16])(*pauStack_f8 + 1);
                }
                (parser->mark).index = (parser->mark).index + 1;
                psVar1 = &(parser->mark).column;
                *psVar1 = *psVar1 + 1;
                psVar1 = &parser->unread;
                *psVar1 = *psVar1 - 1;
                if ((*psVar1 == 0) && (iVar8 = yaml_parser_update_buffer(parser,1), iVar8 == 0))
                goto LAB_00112648;
                pbVar11 = (parser->buffer).pointer;
                bVar13 = *pbVar11;
              } while( true );
            }
            goto LAB_00112642;
          }
LAB_001124b8:
          if (local_ec != -1) {
            iVar9 = yaml_string_join((yaml_char_t **)&local_108,(yaml_char_t **)&pauStack_f8,
                                     (yaml_char_t **)&pauStack_100,(yaml_char_t **)local_128,
                                     (yaml_char_t **)local_118,(yaml_char_t **)(local_128 + 8));
            if (iVar9 == 0) goto LAB_00112642;
            local_118[0] = (undefined1 (*) [16])local_128;
            if (iVar8 == 1) {
              iVar8 = yaml_string_join((yaml_char_t **)&local_108,(yaml_char_t **)&pauStack_f8,
                                       (yaml_char_t **)&pauStack_100,&local_e8.start,
                                       (yaml_char_t **)((long)&local_e8 + 0x10),
                                       (yaml_char_t **)((long)&local_e8 + 8));
              if (iVar8 == 0) goto LAB_00112642;
              local_e8.pointer = local_e8.start;
            }
          }
          stack0xffffffffffffff7c = SUB1612((undefined1  [16])0x0,4);
          local_88._0_4_ = 0x15;
          local_68 = local_c8;
          sStack_60 = sStack_c0;
          local_58 = local_b8;
          local_50 = local_a8.index;
          sStack_48 = local_a8.line;
          local_40 = local_a8.column;
          pauStack_80 = local_108;
          iStack_70 = (literal == 0) + 4;
          local_78 = (long)pauStack_f8 - (long)local_108;
          uStack_6c = 0;
          yaml_free((void *)local_128);
          _local_128 = (undefined1  [16])0x0;
          local_118[0] = (undefined1 (*) [16])0x0;
          yaml_free(local_e8.start);
          tail = &(parser->tokens).tail;
          pyVar18 = (parser->tokens).tail;
          if (pyVar18 == (parser->tokens).end) {
            iVar8 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                      &(parser->tokens).end);
            if (iVar8 == 0) {
              parser->error = YAML_MEMORY_ERROR;
              yaml_token_delete((yaml_token_t *)local_88);
              return 0;
            }
            pyVar18 = *tail;
          }
          *tail = pyVar18 + 1;
          puVar17 = (undefined8 *)local_88;
          for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
            *(undefined8 *)pyVar18 = *puVar17;
            puVar17 = puVar17 + (ulong)bVar20 * -2 + 1;
            pyVar18 = (yaml_token_t *)((long)pyVar18 + (ulong)bVar20 * -0x10 + 8);
          }
          return 1;
        }
        goto LAB_00112648;
      }
    }
  }
LAB_00112642:
  parser->error = YAML_MEMORY_ERROR;
LAB_00112648:
  yaml_free(local_108);
  pauStack_f8 = (undefined1 (*) [16])0x0;
  local_108 = (undefined1 (*) [16])0x0;
  pauStack_100 = (undefined1 (*) [16])0x0;
  yaml_free((void *)local_128);
  local_118[0] = (undefined1 (*) [16])0x0;
  _local_128 = (undefined1  [16])0x0;
  yaml_free(local_e8.start);
  return 0;
LAB_00112274:
  if ((parser->unread < 2) && (iVar8 = yaml_parser_update_buffer(parser,2), iVar8 == 0))
  goto LAB_00112648;
  if ((pauStack_120 <= *local_118[0] + 5) &&
     (iVar8 = yaml_string_extend((yaml_char_t **)local_128,(yaml_char_t **)local_118,
                                 (yaml_char_t **)(local_128 + 8)), iVar8 == 0)) goto LAB_00112642;
  pbVar11 = (parser->buffer).pointer;
  bVar13 = *pbVar11;
  if (bVar13 < 0xc2) {
    if (bVar13 == 10) {
LAB_00112403:
      (*local_118[0])[0] = 10;
      ppyVar2 = &(parser->buffer).pointer;
      *ppyVar2 = *ppyVar2 + 1;
      goto LAB_00112437;
    }
    if (bVar13 != 0xd) goto LAB_00112476;
    if (pbVar11[1] != 10) goto LAB_00112403;
    (*local_118[0])[0] = 10;
    ppyVar2 = &(parser->buffer).pointer;
    *ppyVar2 = *ppyVar2 + 2;
    lVar16 = -2;
    uVar14 = 2;
  }
  else {
    if ((bVar13 != 0xc2) || (pbVar11[1] != 0x85)) goto LAB_00112476;
    (*local_118[0])[0] = 10;
    ppyVar2 = &(parser->buffer).pointer;
    *ppyVar2 = *ppyVar2 + 2;
LAB_00112437:
    lVar16 = -1;
    uVar14 = 1;
  }
  local_118[0] = (undefined1 (*) [16])(*local_118[0] + 1);
  (parser->mark).column = 0;
  (parser->mark).index = (ulong)uVar14 + (parser->mark).index;
  (parser->mark).line = (parser->mark).line + 1;
  parser->unread = parser->unread + lVar16;
LAB_00112476:
  start_mark_01.line = sStack_c0;
  start_mark_01.index = local_c8;
  start_mark_01.column = local_b8;
  iVar8 = yaml_parser_scan_block_scalar_breaks(parser,&local_f0,&local_e8,start_mark_01,&local_a8);
  if (iVar8 == 0) goto LAB_00112648;
  goto LAB_0011201f;
}

Assistant:

static int
yaml_parser_fetch_block_scalar(yaml_parser_t *parser, int literal)
{
    yaml_token_t token;

    /* Remove any potential simple keys. */

    if (!yaml_parser_remove_simple_key(parser))
        return 0;

    /* A simple key may follow a block scalar. */

    parser->simple_key_allowed = 1;

    /* Create the SCALAR token and append it to the queue. */

    if (!yaml_parser_scan_block_scalar(parser, &token, literal))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }

    return 1;
}